

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<Fad<long_double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>_>
::dx(value_type *__return_storage_ptr__,
    FadBinaryMul<Fad<long_double>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>_>
    *this,int i)

{
  int i_00;
  
  atanl();
  FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>
  ::dx(*(value_type **)((long)__return_storage_ptr__ + 8),
       (FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>_>_>_>_>
        *)((ulong)this & 0xffffffff),i_00);
  return *(value_type **)__return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}